

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_string_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  void *pvVar1;
  long *plVar2;
  function_object *pfVar3;
  gc_heap_ptr_untyped *pgVar4;
  long *plVar5;
  anon_class_8_1_54a39808_for_f f;
  int num_args;
  undefined1 local_188 [16];
  gc_heap_ptr_untyped local_178;
  string_view local_168;
  gc_heap_ptr_untyped local_158;
  gc_heap_ptr_untyped local_148;
  undefined1 local_138 [32];
  string_view local_118;
  value p;
  gc_heap_ptr<mjs::string_object> prototype;
  anon_class_24_3_e06c2290 make_string_function;
  gc_heap_ptr<mjs::function_object> c;
  anon_class_32_2_842af841 check_type;
  string_view local_80;
  gc_heap_ptr_untyped local_70;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  gc_heap_ptr_untyped local_40;
  
  pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  h = *(gc_heap **)((long)pvVar1 + 8);
  check_type.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x6;
  check_type.global.super_gc_heap_ptr_untyped._8_8_ = (long)"toISOString" + 5;
  string::string((string *)&p,h,(string_view *)&check_type);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x58))(local_138,plVar2);
  local_188._0_8_ = (gc_heap *)0x0;
  local_188._8_8_ = "";
  string::string((string *)&make_string_function,h,(string_view *)local_188);
  pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  local_158.heap_ = (gc_heap *)CONCAT71(local_158.heap_._1_7_,1 < *(int *)((long)pvVar1 + 0x20));
  gc_heap::make<mjs::string_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,mjs::string,bool>
            ((gc_heap *)&prototype,(string *)h,(gc_heap_ptr<mjs::object> *)&p,(string *)local_138,
             (bool *)&make_string_function);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_string_function);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
  object::class_name((object *)local_138);
  make_raw_function((mjs *)&c,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  check_type.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  check_type.global.super_gc_heap_ptr_untyped._8_8_ =
       check_type.global.super_gc_heap_ptr_untyped._8_8_ & 0xffffffff00000000;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c53f0;
  *(gc_heap **)((long)pvVar1 + 0x10) = h;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&p,(gc_heap_ptr<mjs::gc_string> *)local_138,
             (gc_heap_ptr<mjs::gc_string> *)&check_type,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&check_type);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)local_188,&global->super_gc_heap_ptr_untyped);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5430;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar1 + 0x10),(gc_heap_ptr_untyped *)local_188);
  function_object::construct_function(pfVar3,(gc_heap_ptr<mjs::gc_function> *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  function_object::get_prototype(&p,pfVar3);
  if (p.type_ == object) {
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar1 + 0x20) < 1) {
      pgVar4 = &value::object_value(&p)->super_gc_heap_ptr_untyped;
      plVar2 = (long *)gc_heap_ptr_untyped::get(pgVar4);
      plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar5 + 0x98))(local_138,plVar5,"constructor");
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&make_string_function,&c.super_gc_heap_ptr_untyped);
      value::value((value *)&check_type,(object_ptr *)&make_string_function);
      (**(code **)(*plVar2 + 8))(plVar2,local_138,&check_type,2);
      value::~value((value *)&check_type);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_string_function);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    }
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar5 + 0x98))(&check_type,plVar5,"constructor");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)local_138,&c.super_gc_heap_ptr_untyped);
    value::value(&p,(object_ptr *)local_138);
    (**(code **)(*plVar2 + 8))(plVar2,&check_type,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&check_type);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&c.super_gc_heap_ptr_untyped);
    local_168._M_len = 0xc;
    local_168._M_str = "fromCharCode";
    string::string((string *)&local_178,h,&local_168);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_158);
    make_raw_function((mjs *)local_188,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    local_138._0_8_ = (gc_heap *)0x0;
    local_138._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&check_type,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_type);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5470;
    *(gc_heap **)((long)pvVar1 + 0x10) = h;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&check_type,
               (gc_heap_ptr<mjs::gc_string> *)&local_178,(gc_heap_ptr<mjs::gc_string> *)local_138,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&check_type);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&make_string_function,(gc_heap_ptr_untyped *)local_188);
    value::value(&p,(object_ptr *)&make_string_function);
    (**(code **)(*plVar2 + 8))(plVar2,&local_178,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_string_function);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&check_type,&global->super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&check_type.prototype.super_gc_heap_ptr_untyped,&prototype.super_gc_heap_ptr_untyped)
    ;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x98))(&local_148,plVar2,"toString");
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::__18
              ((__18 *)local_138,&check_type);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_string_function,
               (size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_string_function);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c54b0;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::__18
              ((__18 *)((long)pvVar1 + 0x10),(anon_class_32_2_842af841 *)local_138);
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&make_string_function,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_string_function);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::~__18((__18 *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x98))(&local_148,plVar2,"valueOf");
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::__18
              ((__18 *)local_138,&check_type);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_string_function,
               (size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_string_function);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c54f0;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::__18
              ((__18 *)((long)pvVar1 + 0x10),(anon_class_32_2_842af841 *)local_138);
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)&make_string_function,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_string_function);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::~__18((__18 *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    make_string_function.h = h;
    make_string_function.global = global;
    make_string_function.prototype =
         (gc_heap_ptr<mjs::string_object> *)&prototype.super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    local_118._M_len = 6;
    local_118._M_str = "charAt";
    string::string((string *)&local_148,h,&local_118);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5070;
    *(gc_heap **)((long)pvVar1 + 0x10) = h;
    *(gc_heap **)((long)pvVar1 + 0x18) = h;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,1)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    local_118._M_len = 10;
    local_118._M_str = "charCodeAt";
    string::string((string *)&local_148,h,&local_118);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c50b0;
    *(gc_heap **)((long)pvVar1 + 0x10) = h;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,1)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    local_118._M_len = 7;
    local_118._M_str = "indexOf";
    string::string((string *)&local_148,h,&local_118);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c50f0;
    *(gc_heap **)((long)pvVar1 + 0x10) = h;
    *(gc_heap **)((long)pvVar1 + 0x18) = h;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,2)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    local_118._M_len = 0xb;
    local_118._M_str = "lastIndexOf";
    string::string((string *)&local_148,h,&local_118);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5130;
    *(gc_heap **)((long)pvVar1 + 0x10) = h;
    *(gc_heap **)((long)pvVar1 + 0x18) = h;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,2)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_40,&global->super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_148,&prototype.super_gc_heap_ptr_untyped);
    local_80._M_len = 5;
    local_80._M_str = "split";
    string::string((string *)&local_118,h,&local_80);
    pgVar4 = (gc_heap_ptr_untyped *)(local_138 + 8);
    local_138._0_8_ = h;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(pgVar4,&local_40);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_148);
    make_raw_function((mjs *)&local_168,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    local_158.heap_ = (gc_heap *)0x0;
    local_158.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_188,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5170;
    *(undefined8 *)((long)pvVar1 + 0x10) = local_138._0_8_;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar1 + 0x18),pgVar4);
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_188,
               (gc_heap_ptr<mjs::gc_string> *)&local_118,(gc_heap_ptr<mjs::gc_string> *)&local_158,1
              );
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&local_168);
    value::value(&p,(object_ptr *)&local_178);
    (**(code **)(*plVar2 + 8))(plVar2,&local_118,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar4);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
    local_118._M_len = 9;
    local_118._M_str = "substring";
    string::string((string *)&local_148,h,&local_118);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
    make_raw_function((mjs *)&local_178,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c51b0;
    *(gc_heap **)((long)pvVar1 + 0x10) = h;
    *(gc_heap **)((long)pvVar1 + 0x18) = h;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
               (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,1)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
    value::value(&p,(object_ptr *)&local_158);
    f.h = (gc_heap *)0x2;
    (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
    num_args = (int)h;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)&make_string_function,"toLowerCase",num_args,f);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)&make_string_function,"toUpperCase",num_args,f);
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (0 < *(int *)((long)pvVar1 + 0x20)) {
      make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
                ((__0 *)&make_string_function,"toLocaleLowerCase",num_args,f);
      make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
                ((__0 *)&make_string_function,"toLocaleUpperCase",num_args,f);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
      local_118._M_len = 0xd;
      local_118._M_str = "localeCompare";
      string::string((string *)&local_148,h,&local_118);
      plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      make_raw_function((mjs *)&local_178,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
      local_188._0_8_ = (gc_heap *)0x0;
      local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5270;
      *(gc_heap **)((long)pvVar1 + 0x10) = h;
      *(gc_heap **)((long)pvVar1 + 0x18) = h;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
                 (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,
                 1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
      value::value(&p,(object_ptr *)&local_158);
      (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
      local_118._M_len = 6;
      local_118._M_str = "concat";
      string::string((string *)&local_148,h,&local_118);
      plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      make_raw_function((mjs *)&local_178,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
      local_188._0_8_ = (gc_heap *)0x0;
      local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c52b0;
      *(gc_heap **)((long)pvVar1 + 0x10) = h;
      *(gc_heap **)((long)pvVar1 + 0x18) = h;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
                 (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,
                 1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
      value::value(&p,(object_ptr *)&local_158);
      (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_168,&prototype.super_gc_heap_ptr_untyped);
      local_118._M_len = 5;
      local_118._M_str = "slice";
      string::string((string *)&local_148,h,&local_118);
      plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      make_raw_function((mjs *)&local_178,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_178);
      local_188._0_8_ = (gc_heap *)0x0;
      local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_138,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_138);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c52f0;
      *(gc_heap **)((long)pvVar1 + 0x10) = h;
      *(gc_heap **)((long)pvVar1 + 0x18) = h;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_138,
                 (gc_heap_ptr<mjs::gc_string> *)&local_148,(gc_heap_ptr<mjs::gc_string> *)local_188,
                 2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,&local_178);
      value::value(&p,(object_ptr *)&local_158);
      (**(code **)(*plVar2 + 8))(plVar2,&local_148,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_50,&global->super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_148,&prototype.super_gc_heap_ptr_untyped);
      local_80._M_len = 5;
      local_80._M_str = "match";
      string::string((string *)&local_118,h,&local_80);
      pgVar4 = (gc_heap_ptr_untyped *)(local_138 + 8);
      local_138._0_8_ = h;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(pgVar4,&local_50);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_148);
      make_raw_function((mjs *)&local_168,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5330;
      *(undefined8 *)((long)pvVar1 + 0x10) = local_138._0_8_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar1 + 0x18),pgVar4);
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_118,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&local_168);
      value::value(&p,(object_ptr *)&local_178);
      (**(code **)(*plVar2 + 8))(plVar2,&local_118,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar4);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_60,&global->super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_148,&prototype.super_gc_heap_ptr_untyped);
      local_80._M_len = 6;
      local_80._M_str = "search";
      string::string((string *)&local_118,h,&local_80);
      pgVar4 = (gc_heap_ptr_untyped *)(local_138 + 8);
      local_138._0_8_ = h;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(pgVar4,&local_60);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_148);
      make_raw_function((mjs *)&local_168,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5370;
      *(undefined8 *)((long)pvVar1 + 0x10) = local_138._0_8_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar1 + 0x18),pgVar4);
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_118,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&local_168);
      value::value(&p,(object_ptr *)&local_178);
      (**(code **)(*plVar2 + 8))(plVar2,&local_118,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar4);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_70,&global->super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_148,&prototype.super_gc_heap_ptr_untyped);
      local_80._M_len = 7;
      local_80._M_str = "replace";
      string::string((string *)&local_118,h,&local_80);
      pgVar4 = (gc_heap_ptr_untyped *)(local_138 + 8);
      local_138._0_8_ = h;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(pgVar4,&local_70);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_148);
      make_raw_function((mjs *)&local_168,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c53b0;
      *(undefined8 *)((long)pvVar1 + 0x10) = local_138._0_8_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar1 + 0x18),pgVar4);
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_118,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&local_168);
      value::value(&p,(object_ptr *)&local_178);
      (**(code **)(*plVar2 + 8))(plVar2,&local_118,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar4);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
    }
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (1 < *(int *)((long)pvVar1 + 0x20)) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_148,&prototype.super_gc_heap_ptr_untyped);
      local_80._M_len = 4;
      local_80._M_str = "trim";
      string::string((string *)&local_118,h,&local_80);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)local_138,&global->super_gc_heap_ptr_untyped);
      pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      local_138._16_4_ = *(uint32_t *)((long)pvVar1 + 0x20);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_148);
      make_raw_function((mjs *)&local_168,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5530;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar1 + 0x10),(gc_heap_ptr_untyped *)local_138);
      *(undefined4 *)((long)pvVar1 + 0x20) = local_138._16_4_;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_118,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&local_168);
      value::value(&p,(object_ptr *)&local_178);
      (**(code **)(*plVar2 + 8))(plVar2,&local_118,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_148,&prototype.super_gc_heap_ptr_untyped);
      local_80._M_len = 6;
      local_80._M_str = "substr";
      string::string((string *)&local_118,h,&local_80);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)local_138,&global->super_gc_heap_ptr_untyped);
      pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      local_138._16_4_ = *(uint32_t *)((long)pvVar1 + 0x20);
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_148);
      make_raw_function((mjs *)&local_168,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c5570;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar1 + 0x10),(gc_heap_ptr_untyped *)local_138);
      *(undefined4 *)((long)pvVar1 + 0x20) = local_138._16_4_;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_118,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&local_168);
      value::value(&p,(object_ptr *)&local_178);
      (**(code **)(*plVar2 + 8))(plVar2,&local_118,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    }
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)__return_storage_ptr__,&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped,
               &prototype.super_gc_heap_ptr_untyped);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::~__18((__18 *)&check_type)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
    return __return_storage_ptr__;
  }
  __assert_fail("p.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x59,
                "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:121:35)]"
               );
}

Assistant:

global_object_create_result make_string_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global->heap();
    auto prototype = h.make<string_object>(string{h, "String"}, global->object_prototype(), string{h, ""}, global->language_version() >= version::es5);

    auto c = make_function(global, [&h](const value&, const std::vector<value>& args) {
        return value{args.empty() ? string{h, ""} : to_string(h, args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [global](const value&, const std::vector<value>& args) {
        auto& h = global->heap();
        return value{new_string(global, args.empty() ? string{h, ""} : to_string(h, args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    put_native_function(global, c, string{h, "fromCharCode"}, [&h](const value&, const std::vector<value>& args){
        std::wstring s;
        for (const auto& a: args) {
            s.push_back(to_uint16(a));
        }
        return value{string{h, s}};
    }, 0);

    auto check_type = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "String");
    };

    put_native_function(global, prototype, global->common_string("toString"), [check_type](const value& this_, const std::vector<value>&){
        check_type(this_);
        return value{static_cast<const string_object&>(*this_.object_value()).string_value()};
    }, 0);
    put_native_function(global, prototype, global->common_string("valueOf"), [check_type](const value& this_, const std::vector<value>&){
        check_type(this_);
        return value{static_cast<const string_object&>(*this_.object_value()).string_value()};
    }, 0);


    auto make_string_function = [&](const char* name, int num_args, auto f) {
        put_native_function(global, prototype, string{h, name}, [&h, f](const value& this_, const std::vector<value>& args){
            return value{f(to_string(h, this_), args)};
        }, num_args);
    };

    make_string_function("charAt", 1, [&h](const string& s, const std::vector<value>& args){
        const int position = to_int32(get_arg(args, 0));
        if (position < 0 || position >= static_cast<int>(s.view().length())) {
            return string{h, ""};
        }
        return string{h, s.view().substr(position, 1)};
    });

    make_string_function("charCodeAt", 1, [](const string& s, const std::vector<value>& args){
        const int position = to_int32(get_arg(args, 0));
        if (position < 0 || position >= static_cast<int>(s.view().length())) {
            return static_cast<double>(NAN);
        }
        return static_cast<double>(s.view()[position]);
    });

    make_string_function("indexOf", 2, [&h](const string& s, const std::vector<value>& args){
        const auto& search_string = to_string(h, get_arg(args, 0));
        const int position = to_int32(get_arg(args, 1));
        auto index = s.view().find(search_string.view(), position);
        return index == std::wstring_view::npos ? -1. : static_cast<double>(index);
    });

    make_string_function("lastIndexOf", 2, [&h](const string& s, const std::vector<value>& args){
        const auto& search_string = to_string(h, get_arg(args, 0));
        double position = to_number(get_arg(args, 1));
        const int ipos = std::isnan(position) ? INT_MAX : to_int32(position);
        auto index = s.view().rfind(search_string.view(), ipos);
        return index == std::wstring_view::npos ? -1. : static_cast<double>(index);
    });

    make_string_function("split", 1, [global](const string& str, const std::vector<value>& args){
        const auto s = str.view();
        auto& h = global->heap();
        auto a = make_array(global, 0);
        if (args.empty()) {
            a->put(string{h, index_string(0)}, value{string{h, s}});
        } else {
            const auto sep = to_string(h, args.front());
            if (sep.view().empty()) {
                for (uint32_t i = 0; i < s.length(); ++i) {
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(i,1) }});
                }
            } else {
                size_t pos = 0;
                uint32_t i = 0;
                for (; pos < s.length(); ++i) {
                    const auto next_pos = s.find(sep.view(), pos);
                    if (next_pos == std::wstring_view::npos) {
                        break;
                    }
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(pos, next_pos-pos) }});
                    pos = next_pos + 1;
                }
                if (pos < s.length()) {
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(pos) }});
                }
            }
        }
        return a;
    });

    make_string_function("substring", 1, [&h](const string& str, const std::vector<value>& args) {
        const auto s = str.view();
        int start = std::min(std::max(to_int32(get_arg(args, 0)), 0), static_cast<int>(s.length()));
        if (args.size() < 2) {
            return string{h, s.substr(start)};
        }
        int end = std::min(std::max(to_int32(get_arg(args, 1)), 0), static_cast<int>(s.length()));
        if (start > end) {
            std::swap(start, end);
        }
        return string{h, s.substr(start, end-start)};
    });

    auto to_lower = [&h](const string& s, const std::vector<value>&){
        std::wstring res;
        for (auto c: s.view()) {
            res.push_back(towlower(c));
        }
        return string{h, res};
    };

    auto to_upper = [&h](const string& s, const std::vector<value>&){
        std::wstring res;
        for (auto c: s.view()) {
            res.push_back(towupper(c));
        }
        return string{h, res};
    };

    make_string_function("toLowerCase", 0, to_lower);
    make_string_function("toUpperCase", 0, to_upper);

    if (global->language_version() >= version::es3) {
        make_string_function("toLocaleLowerCase", 0, to_lower);
        make_string_function("toLocaleUpperCase", 0, to_upper);
        make_string_function("localeCompare", 1, [&h](const string& s, const std::vector<value>& args){
            const auto res = s.view().compare(to_string(h, get_arg(args, 0)).view());
            return value{ static_cast<double>(res < 0 ? 1 : res > 0 ? -1 : 0) };
        });
        make_string_function("concat", 1, [&h](const string& s, const std::vector<value>& args) {
            std::wstring res{s.view()};
            for (const auto& a: args) {
                res += to_string(h, a).view();
            }
            return value{string{h, res}};
        });
        make_string_function("slice", 2, [&h](const string& str, const std::vector<value>& args) {
            const auto s = str.view();
            const auto l = static_cast<uint32_t>(s.length());
            const auto ns = to_integer(get_arg(args, 0));
            const auto& end_arg = get_arg(args, 1);
            const auto ne = end_arg.type() == value_type::undefined ? l : to_integer(end_arg);
            const auto start = static_cast<uint32_t>(ns < 0 ? std::max(l + ns, 0.0) : std::min(ns, 0.0+l));
            const auto end   = static_cast<uint32_t>(ne < 0 ? std::max(l + ne, 0.0) : std::min(ne, 0.0+l));
            return value{string{h, s.substr(start, start < end ? end - start : 0)}};
        });
        make_string_function("match", 1, [global](const string& s, const std::vector<value>& args) {
            return string_match(global, s, get_arg(args, 0));
        });
        make_string_function("search", 1, [global](const string& s, const std::vector<value>& args) {
            return string_search(global, s, get_arg(args, 0));
        });
        make_string_function("replace", 2, [global](const string& s, const std::vector<value>& args) {
            return string_replace(global, s, get_arg(args, 0), get_arg(args, 1));
        });
    }
    if (global->language_version() >= version::es5) {
        put_native_function(global, prototype, string{h, "trim"}, [global, ver = global->language_version()](const value& this_, const std::vector<value>&) {
            // CheckObjectCoercible
            if (this_.type() == value_type::undefined || this_.type() == value_type::null) {
                std::ostringstream oss;
                oss << "String.prototype.trim cannot be called on " << this_.type();
                throw native_error_exception(native_error_type::type, global->stack_trace(), oss.str());
            }
            auto& h = global->heap();
            auto s = to_string(h, this_);
            return value{string{h, trim(s.view(), ver)}};
        }, 0);

        put_native_function(global, prototype, string{h, "substr"}, [global, ver = global->language_version()](const value& this_, const std::vector<value>& args) {
            // ES5.1, B.2.3
            auto& h = global.heap();
            // 1
            const auto str = to_string(h, this_);
            // 2
            auto start  = to_integer(args.size() >= 1 ? args[0] : value::undefined);
            // 3
            auto length = args.size() < 2 || args[1].type() == value_type::undefined ? +INFINITY : to_integer(args[1]);
            // 4
            const auto str_len = str.view().length();
            // 5
            if (start < 0) start = std::max(str_len + start, 0.);
            // 6
            length = std::min(std::max(length, 0.), str_len - start);
            // 7
            if (length <= 0) return value{string{h, ""}};
            // 8
            return value{string{h, str.view().substr(static_cast<size_t>(start), static_cast<size_t>(length))}};
        }, 2);
    }

    return {c, prototype};
}